

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O3

int32 read_reg_mat(char *regmatfn,uint32 **veclen,uint32 *n_class,uint32 *n_stream,float32 *****A,
                  float32 ****B)

{
  uint *puVar1;
  uint32 *puVar2;
  uint uVar3;
  int32 iVar4;
  FILE *__stream;
  float32 ****ppppfVar5;
  float32 ***pppfVar6;
  float32 **ppfVar7;
  float32 *pfVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  uint32 nclass;
  uint32 nstream;
  float32 dummy;
  uint local_70;
  uint local_6c;
  uint32 *local_68;
  uint *local_60;
  uint32 **local_58;
  uint32 *local_50;
  float32 *****local_48;
  float32 ****local_40;
  undefined1 local_34 [4];
  
  local_60 = n_class;
  local_58 = veclen;
  local_50 = n_stream;
  local_48 = A;
  local_40 = B;
  __stream = fopen(regmatfn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x66,"Unable to open %s to read MLLR matrices\n",regmatfn);
    iVar4 = -1;
  }
  else {
    __isoc99_fscanf(__stream,"%d",&local_70);
    __isoc99_fscanf(__stream,"%d",&local_6c);
    local_68 = (uint32 *)
               __ckd_calloc__((ulong)local_6c,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                              ,0x6c);
    ppppfVar5 = (float32 ****)
                __ckd_calloc_2d__((ulong)local_70,(ulong)local_6c,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                  ,0x6d);
    pppfVar6 = (float32 ***)
               __ckd_calloc_2d__((ulong)local_70,(ulong)local_6c,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                 ,0x6e);
    uVar9 = (ulong)local_6c;
    if (local_70 == 0) {
      uVar11 = 0;
      uVar3 = local_6c;
    }
    else {
      uVar15 = 0;
      uVar11 = local_70;
      uVar10 = local_6c;
      do {
        bVar17 = uVar10 != 0;
        uVar10 = 0;
        if (bVar17) {
          uVar13 = 0;
          do {
            puVar2 = local_68;
            puVar1 = local_68 + uVar13;
            __isoc99_fscanf(__stream,"%d",puVar1);
            ppfVar7 = (float32 **)
                      __ckd_calloc_2d__((ulong)puVar2[uVar13],(ulong)puVar2[uVar13],4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                        ,0x72);
            ppppfVar5[uVar15][uVar13] = ppfVar7;
            pfVar8 = (float32 *)
                     __ckd_calloc__((ulong)puVar2[uVar13],4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                    ,0x73);
            pppfVar6[uVar15][uVar13] = pfVar8;
            if (puVar2[uVar13] != 0) {
              uVar9 = 1;
              uVar14 = 0;
              do {
                if ((int)uVar9 == 0) goto LAB_0011020c;
                lVar12 = 0;
                uVar16 = 0;
                do {
                  __isoc99_fscanf(__stream,"%f ",(long)ppppfVar5[uVar15][uVar13][uVar14] + lVar12);
                  uVar16 = uVar16 + 1;
                  uVar9 = (ulong)*puVar1;
                  lVar12 = lVar12 + 4;
                } while (uVar16 < uVar9);
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar9);
              if (*puVar1 != 0) {
                lVar12 = 0;
                uVar9 = 0;
                do {
                  __isoc99_fscanf(__stream,"%f ",(long)pppfVar6[uVar15][uVar13] + lVar12);
                  uVar9 = uVar9 + 1;
                  lVar12 = lVar12 + 4;
                } while (uVar9 < *puVar1);
                if (*puVar1 != 0) {
                  uVar11 = 0;
                  do {
                    __isoc99_fscanf(__stream,"%f ",local_34);
                    uVar11 = uVar11 + 1;
                  } while (uVar11 < *puVar1);
                }
              }
            }
LAB_0011020c:
            uVar13 = uVar13 + 1;
            uVar9 = (ulong)local_6c;
            uVar11 = local_70;
            uVar10 = local_6c;
          } while (uVar13 < uVar9);
        }
        uVar3 = (uint)uVar9;
        uVar15 = uVar15 + 1;
      } while (uVar15 < uVar11);
    }
    *local_60 = uVar11;
    *local_50 = uVar3;
    *local_58 = local_68;
    *local_48 = ppppfVar5;
    *local_40 = pppfVar6;
    fclose(__stream);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int32
read_reg_mat (
             const char   *regmatfn,
             uint32  **veclen,
             uint32  *n_class,
             uint32  *n_stream,
             float32 *****A,
             float32 ****B
            )
{
    uint32 i,j,k,m,nstream,nclass;
    FILE  *fp;
    uint32 *vlen;
    float32 ****lA,***lB;

    if ((fp = fopen(regmatfn,"r")) == NULL) {
	E_INFO("Unable to open %s to read MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fscanf(fp,"%d",&nclass);
    fscanf(fp,"%d",&nstream);
    vlen = (uint32 *)ckd_calloc(nstream,sizeof(uint32));
    lA = (float32 ****)ckd_calloc_2d (nclass,nstream,sizeof (float32 **));
    lB = (float32 ***)ckd_calloc_2d (nclass,nstream,sizeof (float32 *));
    for (m = 0; m < nclass; ++m) {
	for (i = 0; i < nstream; ++i) {
	    fscanf(fp,"%d", &vlen[i]);
	    lA[m][i] = (float32 **) ckd_calloc_2d(vlen[i],vlen[i],sizeof(float32));
	    lB[m][i] = (float32 *) ckd_calloc(vlen[i],sizeof(float32));
	    for (j = 0; j < vlen[i]; j++) {
		for (k = 0; k < vlen[i]; ++k) {
		    fscanf(fp,"%f ",&lA[m][i][j][k]);
		}
	    }
	    for (j = 0; j < vlen[i]; j++) {
		fscanf(fp,"%f ",&lB[m][i][j]);
	    }
	    /* Identity transform for variances. */
	    for (j = 0; j < vlen[i]; j++) {
		float32 dummy;
		fscanf(fp,"%f ",&dummy);
	    }
	}
    }

    *n_class = nclass;
    *n_stream = nstream;
    *veclen = vlen;
    *A = lA;
    *B = lB;

    fclose(fp);
    return S3_SUCCESS;
}